

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O2

int DTSStreamReader::buf14To16(uint8_t *p_out,uint8_t *p_in,int i_in,int i_le)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  
  uVar6 = 0;
  uVar4 = (ulong)(uint)i_in;
  if (i_in < 1) {
    uVar4 = uVar6;
  }
  uVar8 = 0;
  iVar9 = 0;
  iVar3 = 0;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    if ((uVar6 & 1) == 0) {
      bVar7 = p_in[uVar6 + (long)i_le] & 0x3f;
      uVar5 = 6;
    }
    else {
      bVar7 = p_in[uVar6 - (long)i_le];
      uVar5 = 8;
    }
    if (iVar9 < 8) {
      uVar1 = 8U - iVar9;
      if (uVar5 < 8U - iVar9) {
        uVar1 = uVar5;
      }
      cVar2 = (char)uVar5;
      uVar5 = uVar5 - uVar1;
      uVar8 = (uint)(bVar7 >> ((byte)uVar5 & 0x1f)) | uVar8 << ((byte)uVar1 & 0x1f);
      bVar7 = bVar7 & (byte)(0xff >> (((byte)uVar1 - cVar2) + 8 & 0x1f));
      iVar9 = iVar9 + uVar1;
    }
    if (iVar9 == 8) {
      p_out[iVar3] = (uint8_t)uVar8;
      iVar3 = iVar3 + 1;
      uVar8 = 0;
      iVar9 = 0;
    }
    iVar9 = iVar9 + uVar5;
    uVar8 = (uint)(byte)(bVar7 | (byte)((uVar8 & 0xff) << ((byte)uVar5 & 0x1f)));
  }
  return iVar3;
}

Assistant:

int DTSStreamReader::buf14To16(uint8_t* p_out, const uint8_t* p_in, const int i_in, const int i_le)
{
    unsigned char tmp, cur = 0;
    int bits_in, bits_out = 0;
    int i_out = 0;
    for (int i = 0; i < i_in; i++)
    {
        if (i % 2)
        {
            tmp = p_in[i - i_le];
            bits_in = 8;
        }
        else
        {
            tmp = p_in[i + i_le] & 0x3F;
            bits_in = 8 - 2;
        }

        if (bits_out < 8)
        {
            const int need = (std::min)(8 - bits_out, bits_in);
            cur <<= need;
            cur |= (tmp >> (bits_in - need));
            tmp <<= (8 - bits_in + need);
            tmp >>= (8 - bits_in + need);
            bits_in -= need;
            bits_out += need;
        }
        if (bits_out == 8)
        {
            p_out[i_out] = cur;
            cur = 0;
            bits_out = 0;
            i_out++;
        }

        bits_out += bits_in;
        cur <<= bits_in;
        cur |= tmp;
    }
    return i_out;
}